

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O2

void __thiscall
jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse
          (SamplingStrategyResponse *this,SamplingStrategyResponse *other15)

{
  _PerOperationSamplingStrategies__isset *p_Var1;
  
  *(undefined ***)this = &PTR__SamplingStrategyResponse_0029b6c0;
  *(undefined ***)&this->probabilisticSampling = &PTR__ProbabilisticSamplingStrategy_0029b520;
  (this->probabilisticSampling).samplingRate = 0.0;
  *(undefined ***)&this->rateLimitingSampling = &PTR__RateLimitingSamplingStrategy_0029b588;
  (this->rateLimitingSampling).maxTracesPerSecond = 0;
  *(undefined ***)&this->operationSampling = &PTR__PerOperationSamplingStrategies_0029b658;
  (this->operationSampling).defaultSamplingProbability = 0.0;
  (this->operationSampling).defaultLowerBoundTracesPerSecond = 0.0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operationSampling).perOperationStrategies.
  super__Vector_base<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy,_std::allocator<jaegertracing::sampling_manager::thrift::OperationSamplingStrategy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operationSampling).defaultUpperBoundTracesPerSecond = 0.0;
  p_Var1 = &(this->operationSampling).__isset;
  *p_Var1 = (_PerOperationSamplingStrategies__isset)((byte)*p_Var1 & 0xfe);
  this->__isset = (_SamplingStrategyResponse__isset)((byte)this->__isset & 0xf8);
  this->strategyType = other15->strategyType;
  (this->probabilisticSampling).samplingRate = (other15->probabilisticSampling).samplingRate;
  (this->rateLimitingSampling).maxTracesPerSecond =
       (other15->rateLimitingSampling).maxTracesPerSecond;
  PerOperationSamplingStrategies::operator=(&this->operationSampling,&other15->operationSampling);
  this->__isset = other15->__isset;
  return;
}

Assistant:

SamplingStrategyResponse::SamplingStrategyResponse(const SamplingStrategyResponse& other15) {
  strategyType = other15.strategyType;
  probabilisticSampling = other15.probabilisticSampling;
  rateLimitingSampling = other15.rateLimitingSampling;
  operationSampling = other15.operationSampling;
  __isset = other15.__isset;
}